

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

int pageant_enum_keys(pageant_key_enum_fn_t callback,void *callback_ctx,char **retstr)

{
  KeyList *kl;
  char *pcVar1;
  char **ppcVar2;
  char **fingerprints_1;
  size_t i_1;
  char **fingerprints;
  BinarySource src [1];
  RSAKey rkey;
  size_t i;
  undefined1 auStack_48 [4];
  int toret;
  pageant_pubkey cbkey;
  KeyList *kl2;
  KeyList *kl1;
  char **retstr_local;
  void *callback_ctx_local;
  pageant_key_enum_fn_t callback_local;
  
  cbkey.ssh_version = 0;
  cbkey._20_4_ = 0;
  i._4_4_ = 1;
  kl = pageant_get_keylist(1);
  if ((kl == (KeyList *)0x0) || ((kl->broken & 1U) == 0)) {
    cbkey._16_8_ = pageant_get_keylist(2);
    if (((KeyList *)cbkey._16_8_ == (KeyList *)0x0) ||
       ((((KeyList *)cbkey._16_8_)->broken & 1U) == 0)) {
      if (kl != (KeyList *)0x0) {
        for (rkey.sshk.vt = (ssh_keyalg *)0x0; rkey.sshk.vt < (ssh_keyalg *)kl->nkeys;
            rkey.sshk.vt = (ssh_keyalg *)((long)&(rkey.sshk.vt)->new_pub + 1)) {
          _auStack_48 = strbuf_dup(kl->keys[(long)rkey.sshk.vt].blob);
          cbkey.blob = (strbuf *)mkstr(kl->keys[(long)rkey.sshk.vt].comment);
          cbkey.comment._0_4_ = 1;
          memset(&src[0].binarysource_,0,0x48);
          BinarySource_INIT__((BinarySource *)&fingerprints,kl->keys[(long)rkey.sshk.vt].blob);
          BinarySource_get_rsa_ssh1_pub
                    ((BinarySource *)src[0]._24_8_,(RSAKey *)&src[0].binarysource_,
                     RSA_SSH1_EXPONENT_FIRST);
          if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
            pcVar1 = dupstr("Received an invalid SSH-1 key from agent");
            *retstr = pcVar1;
            goto LAB_0011a465;
          }
          ppcVar2 = rsa_ssh1_fake_all_fingerprints((RSAKey *)&src[0].binarysource_);
          freersakey((RSAKey *)&src[0].binarysource_);
          (*callback)(callback_ctx,ppcVar2,(char *)cbkey.blob,kl->keys[(long)rkey.sshk.vt].flags,
                      (pageant_pubkey *)auStack_48);
          strbuf_free(_auStack_48);
          safefree(cbkey.blob);
          ssh2_free_all_fingerprints(ppcVar2);
        }
      }
      if (cbkey._16_8_ != 0) {
        for (fingerprints_1 = (char **)0x0; fingerprints_1 < *(char ***)(cbkey._16_8_ + 0x10);
            fingerprints_1 = (char **)((long)fingerprints_1 + 1)) {
          _auStack_48 = strbuf_dup(*(ptrlen *)
                                    (*(long *)(cbkey._16_8_ + 8) + (long)fingerprints_1 * 0x28));
          cbkey.blob = (strbuf *)
                       mkstr(*(ptrlen *)
                              (*(long *)(cbkey._16_8_ + 8) + (long)fingerprints_1 * 0x28 + 0x10));
          cbkey.comment._0_4_ = 2;
          ppcVar2 = ssh2_all_fingerprints_for_blob
                              (*(ptrlen *)
                                (*(long *)(cbkey._16_8_ + 8) + (long)fingerprints_1 * 0x28));
          (*callback)(callback_ctx,ppcVar2,(char *)cbkey.blob,
                      *(uint32_t *)
                       (*(long *)(cbkey._16_8_ + 8) + (long)fingerprints_1 * 0x28 + 0x20),
                      (pageant_pubkey *)auStack_48);
          ssh2_free_all_fingerprints(ppcVar2);
          safefree(cbkey.blob);
          strbuf_free(_auStack_48);
        }
      }
      *retstr = (char *)0x0;
      i._4_4_ = 0;
    }
    else {
      pcVar1 = dupstr("Received broken SSH-2 key list from agent");
      *retstr = pcVar1;
    }
  }
  else {
    pcVar1 = dupstr("Received broken SSH-1 key list from agent");
    *retstr = pcVar1;
  }
LAB_0011a465:
  if (kl != (KeyList *)0x0) {
    keylist_free(kl);
  }
  if (cbkey._16_8_ != 0) {
    keylist_free((KeyList *)cbkey._16_8_);
  }
  return i._4_4_;
}

Assistant:

int pageant_enum_keys(pageant_key_enum_fn_t callback, void *callback_ctx,
                      char **retstr)
{
    KeyList *kl1 = NULL, *kl2 = NULL;
    struct pageant_pubkey cbkey;
    int toret = PAGEANT_ACTION_FAILURE;

    kl1 = pageant_get_keylist(1);
    if (kl1 && kl1->broken) {
        *retstr = dupstr("Received broken SSH-1 key list from agent");
        goto out;
    }

    kl2 = pageant_get_keylist(2);
    if (kl2 && kl2->broken) {
        *retstr = dupstr("Received broken SSH-2 key list from agent");
        goto out;
    }

    if (kl1) {
        for (size_t i = 0; i < kl1->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl1->keys[i].blob);
            cbkey.comment = mkstr(kl1->keys[i].comment);
            cbkey.ssh_version = 1;

            /* Decode public blob into a key in order to fingerprint it */
            RSAKey rkey;
            memset(&rkey, 0, sizeof(rkey));
            {
                BinarySource src[1];
                BinarySource_BARE_INIT_PL(src, kl1->keys[i].blob);
                get_rsa_ssh1_pub(src, &rkey, RSA_SSH1_EXPONENT_FIRST);
                if (get_err(src)) {
                    *retstr = dupstr(
                        "Received an invalid SSH-1 key from agent");
                    goto out;
                }
            }
            char **fingerprints = rsa_ssh1_fake_all_fingerprints(&rkey);
            freersakey(&rkey);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl1->keys[i].flags, &cbkey);

            strbuf_free(cbkey.blob);
            sfree(cbkey.comment);
            ssh2_free_all_fingerprints(fingerprints);
        }
    }

    if (kl2) {
        for (size_t i = 0; i < kl2->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl2->keys[i].blob);
            cbkey.comment = mkstr(kl2->keys[i].comment);
            cbkey.ssh_version = 2;

            char **fingerprints =
                ssh2_all_fingerprints_for_blob(kl2->keys[i].blob);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl2->keys[i].flags, &cbkey);

            ssh2_free_all_fingerprints(fingerprints);
            sfree(cbkey.comment);
            strbuf_free(cbkey.blob);
        }
    }

    *retstr = NULL;
    toret = PAGEANT_ACTION_OK;
  out:
    if (kl1)
        keylist_free(kl1);
    if (kl2)
        keylist_free(kl2);
    return toret;
}